

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::xor_(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  uintptr_t uStack_30;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == i64) {
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len =
         (other->field_0).func.super_IString.str._M_len ^
         (this->field_0).func.super_IString.str._M_len;
    uStack_30 = 3;
  }
  else {
    if (BVar1 != i32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x562);
    }
    (__return_storage_ptr__->field_0).i32 = (other->field_0).i32 ^ (this->field_0).i32;
    uStack_30 = 2;
  }
  (__return_storage_ptr__->type).id = uStack_30;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::xor_(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 ^ other.i32);
    case Type::i64:
      return Literal(i64 ^ other.i64);
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}